

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# input_stream.hpp
# Opt level: O2

char_t __thiscall
cfgfile::input_stream_t<cfgfile::string_trait_t>::get(input_stream_t<cfgfile::string_trait_t> *this)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [15];
  bool bVar5;
  _Elt_pointer pcVar6;
  size_t sVar7;
  char_t ch;
  undefined1 local_28 [24];
  
  bVar5 = at_end(this);
  if (bVar5) {
    local_28[0] = '\0';
  }
  else {
    uVar1 = this->m_line_number;
    uVar2 = this->m_column_number;
    local_28._8_4_ = (int)uVar1;
    local_28._0_8_ = uVar2;
    local_28._12_4_ = (int)((ulong)uVar1 >> 0x20);
    std::
    deque<cfgfile::input_stream_t<cfgfile::string_trait_t>::position_t,_std::allocator<cfgfile::input_stream_t<cfgfile::string_trait_t>::position_t>_>
    ::emplace_back<cfgfile::input_stream_t<cfgfile::string_trait_t>::position_t>
              (&(this->m_prev_positions).c,(position_t *)local_28);
    this->m_column_number = this->m_column_number + 1;
    auVar4 = local_28._1_15_;
    auVar3[0xf] = 0;
    auVar3._0_15_ = local_28._1_15_;
    local_28._0_16_ = auVar3 << 8;
    pcVar6 = (this->m_returned_char).c.super__Deque_base<char,_std::allocator<char>_>._M_impl.
             super__Deque_impl_data._M_finish._M_cur;
    if (pcVar6 == (this->m_returned_char).c.super__Deque_base<char,_std::allocator<char>_>._M_impl.
                  super__Deque_impl_data._M_start._M_cur) {
      sVar7 = this->m_buf_pos;
      if (sVar7 == 0x200) {
        string_trait_t::fill_buf
                  (this->m_stream,&this->m_buf,0x200,&this->m_stream_pos,this->m_stream_size);
        this->m_buf_pos = 0;
        sVar7 = 0;
      }
      local_28[0] = (this->m_buf).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_start[sVar7];
      this->m_buf_pos = sVar7 + 1;
    }
    else {
      if (pcVar6 == (this->m_returned_char).c.super__Deque_base<char,_std::allocator<char>_>._M_impl
                    .super__Deque_impl_data._M_finish._M_first) {
        pcVar6 = (this->m_returned_char).c.super__Deque_base<char,_std::allocator<char>_>._M_impl.
                 super__Deque_impl_data._M_finish._M_node[-1] + 0x200;
      }
      local_28[0] = pcVar6[-1];
      local_28._0_16_ = CONCAT151(auVar4,local_28[0]);
      std::deque<char,_std::allocator<char>_>::pop_back(&(this->m_returned_char).c);
    }
    bVar5 = is_new_line(this,local_28);
    if (bVar5) {
      this->m_line_number = this->m_line_number + 1;
      this->m_column_number = 1;
    }
  }
  return local_28[0];
}

Assistant:

typename Trait::char_t get()
	{
		if( !at_end() )
		{
			m_prev_positions.push( { m_column_number, m_line_number } );

			m_column_number += 1;

			typename Trait::char_t ch( 0x00 );

			if( !m_returned_char.empty() )
			{
				ch = m_returned_char.top();

				m_returned_char.pop();

				if( is_new_line( ch ) )
				{
					m_line_number += 1;
					m_column_number = 1;
				}

				return ch;
			}

			if( m_buf_pos == c_buff_size )
			{
				Trait::fill_buf( m_stream, m_buf, c_buff_size, m_stream_pos, m_stream_size );
				m_buf_pos = 0;
			}

			ch = m_buf[ m_buf_pos ];

			++m_buf_pos;

			if( is_new_line( ch ) )
			{
				m_line_number += 1;
				m_column_number = 1;
			}

			return ch;
		}
		else
			return typename Trait::char_t( 0x00 );
	}